

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O0

void QtDebugUtils::formatNonNullQFlags<Qt::KeyboardModifier>
               (QDebug *debug,char *prefix,QFlags<Qt::KeyboardModifier> *value)

{
  Int IVar1;
  QFlags *in_RDX;
  char *in_stack_00000038;
  
  IVar1 = ::QFlags::operator_cast_to_unsigned_int(in_RDX);
  if (IVar1 != 0) {
    QDebug::operator<<((QDebug *)prefix,in_stack_00000038);
    formatQFlags<Qt::KeyboardModifier>((QDebug *)prefix,value);
  }
  return;
}

Assistant:

static inline void formatNonNullQFlags(QDebug &debug, const char *prefix, const QFlags<Enum> &value)
{
    if (value) {
        debug << prefix;
        formatQFlags(debug, value);
    }
}